

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YolactDetector.cpp
# Opt level: O2

int __thiscall
Yolact::detect(Yolact *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects,
              string *targetName)

{
  undefined8 uVar1;
  uint h;
  uint w;
  void *pvVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  bool bVar6;
  int y;
  int iVar7;
  size_type __new_size;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int j_1;
  int iVar13;
  long lVar14;
  float *pfVar15;
  ulong uVar16;
  Object *this_00;
  Yolact *this_01;
  long lVar17;
  long lVar18;
  long lVar19;
  vector<Object,_std::allocator<Object>_> *objects_00;
  int j;
  int iVar20;
  int iVar21;
  pointer pOVar22;
  float fVar23;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float local_498;
  float fStack_494;
  uint local_470;
  uint local_46c;
  float local_468;
  float fStack_464;
  undefined8 local_458;
  undefined8 uStack_450;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  Mat maskmaps;
  Mat confidence;
  Mat mask2;
  size_t local_398;
  long *local_360;
  Mat mask;
  undefined4 local_300 [2];
  Mat *local_2f8;
  undefined8 local_2f0;
  Mat location;
  vector<int,_std::allocator<int>_> picked;
  vector<float,_std::allocator<float>_> local_290 [5];
  undefined8 local_218;
  undefined8 uStack_210;
  float local_208;
  float fStack_204;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  Extractor ex;
  Mat priorbox;
  float norm_vals [3];
  float mean_vals [3];
  Mat in;
  undefined4 local_100 [2];
  vector<int,_std::allocator<int>_> *local_f8;
  undefined8 local_f0;
  Net yolact;
  
  ncnn::Net::Net(&yolact);
  yolact.opt.use_vulkan_compute = false;
  ncnn::Net::load_param(&yolact,"yolact.param");
  ncnn::Net::load_model(&yolact,"yolact.bin");
  h = *(uint *)(image + 8);
  w = *(uint *)(image + 0xc);
  ncnn::Mat::from_pixels_resize
            (&in,*(uchar **)(image + 0x10),0x10002,w,h,0x226,0x226,(Allocator *)0x0);
  mean_vals[0] = 123.68;
  mean_vals[1] = 116.78;
  mean_vals[2] = 103.94;
  norm_vals[0] = 0.017123288;
  norm_vals[1] = 0.017507004;
  norm_vals[2] = 0.017427675;
  ncnn::Mat::substract_mean_normalize(&in,mean_vals,norm_vals);
  ncnn::Net::create_extractor(&ex,&yolact);
  ncnn::Extractor::input(&ex,"input.1",&in);
  maskmaps.elemsize._0_4_ = 0;
  maskmaps.elemsize._4_4_ = 0;
  maskmaps.elempack = 0;
  maskmaps.data = (void *)0x0;
  maskmaps.refcount._0_4_ = 0;
  maskmaps.refcount._4_4_ = 0;
  maskmaps.allocator = (Allocator *)0x0;
  maskmaps.dims = 0;
  maskmaps.w = 0;
  maskmaps.h = 0;
  maskmaps.c = 0;
  maskmaps.cstep = 0;
  location.elemsize._0_4_ = 0;
  location.elemsize._4_4_ = 0;
  location.elempack = 0;
  location.data = (void *)0x0;
  location.refcount._0_4_ = 0;
  location.refcount._4_4_ = 0;
  location.allocator = (Allocator *)0x0;
  location.dims = 0;
  location.w = 0;
  location.h = 0;
  location.c = 0;
  location.cstep = 0;
  mask.elemsize._0_4_ = 0;
  mask.elemsize._4_4_ = 0;
  mask.elempack = 0;
  mask.data = (void *)0x0;
  mask.refcount._0_4_ = 0;
  mask.refcount._4_4_ = 0;
  mask.allocator = (Allocator *)0x0;
  mask.dims = 0;
  mask.w = 0;
  mask.h = 0;
  mask.c = 0;
  mask.cstep = 0;
  confidence.elemsize._0_4_ = 0;
  confidence.elemsize._4_4_ = 0;
  confidence.elempack = 0;
  confidence.data = (void *)0x0;
  confidence.refcount._0_4_ = 0;
  confidence.refcount._4_4_ = 0;
  confidence.allocator = (Allocator *)0x0;
  confidence.dims = 0;
  confidence.w = 0;
  confidence.h = 0;
  confidence.c = 0;
  confidence.cstep = 0;
  ncnn::Extractor::extract(&ex,"619",&maskmaps);
  ncnn::Extractor::extract(&ex,"816",&location);
  ncnn::Extractor::extract(&ex,"818",&mask);
  ncnn::Extractor::extract(&ex,"820",&confidence);
  __new_size = (size_type)confidence.w;
  iVar7 = confidence.h;
  ncnn::Mat::Mat(&priorbox,4,confidence.h,4,(Allocator *)0x0);
  lVar18 = 0;
  pfVar15 = (float *)priorbox.data;
  while (lVar18 != 5) {
    iVar21 = (&DAT_00173a50)[lVar18];
    fVar25 = (float)(&DAT_00173a70)[lVar18];
    local_468 = (float)iVar21;
    iVar13 = 0;
    local_458 = lVar18;
    if (iVar21 < 1) {
      iVar21 = iVar13;
    }
    for (; iVar13 != iVar21; iVar13 = iVar13 + 1) {
      fVar29 = ((float)iVar13 + 0.5) / local_468;
      for (iVar20 = 0; iVar20 != iVar21; iVar20 = iVar20 + 1) {
        fVar31 = ((float)iVar20 + 0.5) / local_468;
        for (lVar18 = 0; lVar18 != 0xc; lVar18 = lVar18 + 4) {
          fVar23 = *(float *)((long)&DAT_00173a64 + lVar18);
          if (fVar23 < 0.0) {
            fVar23 = sqrtf(fVar23);
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          fVar23 = (fVar23 * fVar25) / 550.0;
          *pfVar15 = fVar31;
          pfVar15[1] = fVar29;
          pfVar15[2] = fVar23;
          pfVar15[3] = fVar23;
          pfVar15 = pfVar15 + 4;
        }
      }
    }
    lVar18 = local_458 + 1;
  }
  class_candidates.
  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0);
  class_candidates.
  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  this_00 = (Object *)&class_candidates;
  class_candidates.
  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::resize((vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
            *)this_00,__new_size);
  iVar21 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  for (; pvVar5 = priorbox.data, pvVar4 = location.data, pvVar2 = mask.data, iVar21 != iVar7;
      iVar21 = iVar21 + 1) {
    lVar8 = (long)iVar21;
    lVar19 = location.w * lVar8 * CONCAT44(location.elemsize._4_4_,(undefined4)location.elemsize);
    lVar14 = priorbox.w * lVar8 * priorbox.elemsize;
    lVar17 = (long)mask.w;
    lVar18 = CONCAT44(mask.elemsize._4_4_,(undefined4)mask.elemsize);
    uVar9 = 0;
    fVar25 = 0.0;
    for (uVar11 = 1; (long)uVar11 < (long)__new_size; uVar11 = uVar11 + 1) {
      fVar29 = *(float *)((long)confidence.data +
                         uVar11 * 4 +
                         (long)(confidence.w * iVar21) *
                         CONCAT44(confidence.elemsize._4_4_,(undefined4)confidence.elemsize));
      if (fVar25 < fVar29) {
        uVar9 = uVar11 & 0xffffffff;
        fVar25 = fVar29;
      }
    }
    iVar13 = (int)uVar9;
    if (((iVar13 != 0) && (0.2 < fVar25)) &&
       (bVar6 = isTargetObj((Yolact *)this_00,iVar13,targetName), bVar6)) {
      local_468 = expf(*(float *)((long)pvVar4 + lVar19 + 8) * 0.2);
      fStack_464 = extraout_XMM0_Db;
      local_208 = expf(*(float *)((long)pvVar4 + lVar19 + 0xc) * 0.2);
      local_458 = *(long *)((long)pvVar5 + lVar14);
      uStack_450 = 0;
      local_1f8 = *(undefined8 *)((long)pvVar5 + lVar14 + 8);
      uStack_1f0 = 0;
      uVar1 = *(undefined8 *)((long)pvVar4 + lVar19);
      local_218 = *(undefined8 *)(image + 8);
      uStack_210 = 0;
      this_00 = (Object *)&picked;
      fStack_204 = extraout_XMM0_Db_00;
      Object::Object(this_00);
      pfVar15 = (float *)((long)pvVar2 + lVar17 * lVar8 * lVar18);
      local_498 = (float)uVar1;
      fStack_494 = (float)((ulong)uVar1 >> 0x20);
      fVar32 = local_498 * 0.1 * (float)local_1f8 + (float)local_458;
      fVar33 = fStack_494 * 0.1 * local_1f8._4_4_ + local_458._4_4_;
      fVar34 = (float)uStack_1f0 * 0.0 + (float)uStack_450;
      fVar35 = uStack_1f0._4_4_ * 0.0 + uStack_450._4_4_;
      fVar29 = local_468 * (float)local_1f8 * 0.5;
      fVar31 = local_208 * local_1f8._4_4_ * 0.5;
      fVar23 = fStack_464 * (float)uStack_1f0 * 0.0;
      fVar30 = fStack_204 * uStack_1f0._4_4_ * 0.0;
      auVar26._0_4_ = (fVar29 + fVar32) * (float)local_218._4_4_;
      auVar26._4_4_ = (fVar31 + fVar33) * (float)(int)local_218;
      auVar26._8_4_ = (fVar23 + fVar34) * (float)(int)uStack_210;
      auVar26._12_4_ = (fVar30 + fVar35) * (float)local_218._4_4_;
      auVar24._0_8_ = CONCAT44((float)((int)local_218 + -1),(float)(local_218._4_4_ + -1));
      auVar24._8_4_ = (float)((int)uStack_210 + -1);
      auVar24._12_4_ = (float)(local_218._4_4_ + -1);
      auVar27._8_4_ = auVar24._8_4_;
      auVar27._0_8_ = auVar24._0_8_;
      auVar27._12_4_ = auVar24._12_4_;
      auVar28 = minps(auVar27,auVar26);
      auVar26 = maxps(ZEXT816(0),auVar28);
      auVar28._4_4_ = (fVar33 - fVar31) * (float)(int)local_218;
      auVar28._0_4_ = (fVar32 - fVar29) * (float)local_218._4_4_;
      auVar28._8_4_ = (fVar34 - fVar23) * (float)(int)uStack_210;
      auVar28._12_4_ = (fVar35 - fVar30) * (float)local_218._4_4_;
      auVar28 = minps(auVar24,auVar28);
      auVar28 = maxps(ZEXT816(0),auVar28);
      picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = auVar28._0_8_;
      picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)CONCAT44((auVar26._4_4_ - auVar28._4_4_) + 1.0,
                               (auVar26._0_4_ - auVar28._0_4_) + 1.0);
      picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)CONCAT44(fVar25,iVar13);
      std::vector<float,std::allocator<float>>::vector<float_const*,void>
                ((vector<float,std::allocator<float>> *)&mask2,pfVar15,pfVar15 + mask.w,
                 (allocator_type *)local_100);
      std::vector<float,_std::allocator<float>_>::_M_move_assign
                (local_290,(vector<float,std::allocator<float>> *)&mask2);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&mask2);
      std::vector<Object,_std::allocator<Object>_>::push_back
                (class_candidates.
                 super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar13,this_00);
      Object::~Object(this_00);
    }
  }
  std::vector<Object,_std::allocator<Object>_>::clear(objects);
  lVar18 = 0;
  while( true ) {
    if ((int)(((long)class_candidates.
                     super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)class_candidates.
                    super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= lVar18) break;
    objects_00 = class_candidates.
                 super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar18;
    this_01 = this;
    qsort_descent_inplace(this,objects_00);
    picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    nms_sorted_bboxes(this_01,objects_00,&picked,0.5);
    for (lVar8 = 0;
        lVar8 < (int)((ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2); lVar8 = lVar8 + 1) {
      std::vector<Object,_std::allocator<Object>_>::push_back
                (objects,(objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                         super__Vector_impl_data._M_start +
                         picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar8]);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&picked.super__Vector_base<int,_std::allocator<int>_>);
    lVar18 = lVar18 + 1;
  }
  qsort_descent_inplace(this,objects);
  if (200 < (int)(((long)(objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                        super__Vector_impl_data._M_start) / 0x90)) {
    std::vector<Object,_std::allocator<Object>_>::resize(objects,200);
  }
  uVar11 = 0;
  if (0 < (int)w) {
    uVar11 = (ulong)w;
  }
  uVar9 = 0;
  if (0 < (int)h) {
    uVar9 = (ulong)h;
  }
  for (uVar16 = 0;
      pOVar22 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar16 < (ulong)(((long)(objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl
                              .super__Vector_impl_data._M_finish - (long)pOVar22) / 0x90);
      uVar16 = uVar16 + 1) {
    cv::Mat::Mat((Mat *)&picked,maskmaps.h,maskmaps.w,5);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&mask2,0.0);
    cv::Mat::operator=((Mat *)&picked,(Scalar_ *)&mask2);
    pOVar22 = pOVar22 + uVar16;
    for (lVar18 = 0; sVar3 = maskmaps.cstep, pvVar2 = maskmaps.data, lVar18 < maskmaps.c;
        lVar18 = lVar18 + 1) {
      local_398 = CONCAT44(maskmaps.elemsize._4_4_,(undefined4)maskmaps.elemsize);
      _mask2 = (void *)(maskmaps.cstep * lVar18 * local_398 + (long)maskmaps.data);
      ncnn::Mat::~Mat((Mat *)&mask2);
      fVar25 = *(float *)(*(long *)&(pOVar22->maskdata).
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data + lVar18 * 4);
      uVar10 = (ulong)(uint)(maskmaps.h * maskmaps.w);
      if (maskmaps.h * maskmaps.w < 1) {
        uVar10 = 0;
      }
      for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage[uVar12] =
             (int)(*(float *)((long)pvVar2 + uVar12 * 4 + sVar3 * local_398 * lVar18) * fVar25 +
                  (float)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[uVar12]);
      }
    }
    cv::Mat::Mat(&mask2);
    local_f0 = 0;
    local_100[0] = 0x1010000;
    local_f8 = &picked;
    local_2f0 = 0;
    local_300[0] = 0x2010000;
    local_470 = w;
    local_46c = h;
    local_2f8 = &mask2;
    cv::resize((Mat *)local_100,local_300,&local_470);
    cv::Mat::Mat((Mat *)local_100,h,w,0);
    cv::Mat::operator=(&pOVar22->mask,(Mat *)local_100);
    cv::Mat::~Mat((Mat *)local_100);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_100,0.0);
    cv::Mat::operator=(&pOVar22->mask,(Scalar_ *)local_100);
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      fVar25 = (pOVar22->rect).y;
      if ((fVar25 <= (float)(int)uVar10) && ((float)(int)uVar10 <= fVar25 + (pOVar22->rect).height))
      {
        lVar18 = **(long **)&pOVar22->field_0x78;
        lVar8 = *(long *)&pOVar22->field_0x40;
        lVar14 = *local_360;
        for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          fVar25 = (pOVar22->rect).x;
          if ((fVar25 <= (float)(int)uVar12) &&
             ((float)(int)uVar12 <= fVar25 + (pOVar22->rect).width)) {
            *(char *)(lVar18 * uVar10 + lVar8 + uVar12) =
                 -(0.5 < *(float *)(lVar14 * uVar10 + local_398 + uVar12 * 4));
          }
        }
      }
    }
    cv::Mat::~Mat(&mask2);
    cv::Mat::~Mat((Mat *)&picked);
  }
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::~vector(&class_candidates);
  ncnn::Mat::~Mat(&priorbox);
  ncnn::Mat::~Mat(&confidence);
  ncnn::Mat::~Mat(&mask);
  ncnn::Mat::~Mat(&location);
  ncnn::Mat::~Mat(&maskmaps);
  ncnn::Extractor::~Extractor(&ex);
  ncnn::Mat::~Mat(&in);
  ncnn::Net::~Net(&yolact);
  return 0;
}

Assistant:

int Yolact::detect(cv::Mat& image, std::vector<Object>& objects, const std::string &targetName) 
{
    ncnn::Net yolact;

    yolact.opt.use_vulkan_compute = false;

    // original model converted from https://github.com/dbolya/yolact
    // yolact_resnet50_54_800000.pth
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
    yolact.load_param("yolact.param");
    yolact.load_model("yolact.bin");

    const int target_size = 550;

    int img_w = image.cols;
    int img_h = image.rows;

    ncnn::Mat in = ncnn::Mat::from_pixels_resize(image.data, ncnn::Mat::PIXEL_BGR2RGB, img_w, img_h, target_size, target_size);

    const float mean_vals[3] = {123.68f, 116.78f, 103.94f};
    const float norm_vals[3] = {1.0 / 58.40f, 1.0 / 57.12f, 1.0 / 57.38f};
    in.substract_mean_normalize(mean_vals, norm_vals);

    ncnn::Extractor ex = yolact.create_extractor();
    //     ex.set_num_threads(4);

    ex.input("input.1", in);

    ncnn::Mat maskmaps;
    ncnn::Mat location;
    ncnn::Mat mask;
    ncnn::Mat confidence;

    ex.extract("619", maskmaps); // 138x138 x 32

    ex.extract("816", location);   // 4 x 19248
    ex.extract("818", mask);       // maskdim 32 x 19248
    ex.extract("820", confidence); // 81 x 19248

    int num_class = confidence.w;
    int num_priors = confidence.h;

    // make priorbox
    ncnn::Mat priorbox(4, num_priors);
    {
        const int conv_ws[5] = {69, 35, 18, 9, 5};
        const int conv_hs[5] = {69, 35, 18, 9, 5};

        const float aspect_ratios[3] = {1.f, 0.5f, 2.f};
        const float scales[5] = {24.f, 48.f, 96.f, 192.f, 384.f};

        float* pb = priorbox;

        for (int p = 0; p < 5; p++)
        {
            int conv_w = conv_ws[p];
            int conv_h = conv_hs[p];

            float scale = scales[p];

            for (int i = 0; i < conv_h; i++)
            {
                for (int j = 0; j < conv_w; j++)
                {
                    // +0.5 because priors are in center-size notation
                    float cx = (j + 0.5f) / conv_w;
                    float cy = (i + 0.5f) / conv_h;

                    for (int k = 0; k < 3; k++)
                    {
                        float ar = aspect_ratios[k];

                        ar = sqrt(ar);

                        float w = scale * ar / 550;
                        float h = scale / ar / 550;

                        // This is for backward compatability with a bug where I made everything square by accident
                        // cfg.backbone.use_square_anchors:
                        h = w;

                        pb[0] = cx;
                        pb[1] = cy;
                        pb[2] = w;
                        pb[3] = h;

                        pb += 4;
                    }
                }
            }
        }
    }

    const float confidence_thresh = 0.2f;
    const float nms_threshold = 0.5f;
    const int keep_top_k = 200;

    std::vector<std::vector<Object> > class_candidates;
    class_candidates.resize(num_class);

    for (int i = 0; i < num_priors; i++)
    {
        const float* conf = confidence.row(i);
        const float* loc = location.row(i);
        const float* pb = priorbox.row(i);
        const float* maskdata = mask.row(i);

        // find class id with highest score
        // start from 1 to skip background
        int label = 0;
        float score = 0.f;
        for (int j = 1; j < num_class; j++)
        {
            float class_score = conf[j];
            if (class_score > score)
            {
                label = j;
                score = class_score;
            }
        }

        // ignore background or low score
        if (label == 0 || score <= confidence_thresh || !isTargetObj(label, targetName))
            continue;

        // CENTER_SIZE
        float var[4] = {0.1f, 0.1f, 0.2f, 0.2f};

        float pb_cx = pb[0];
        float pb_cy = pb[1];
        float pb_w = pb[2];
        float pb_h = pb[3];

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = (float)(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = (float)(exp(var[3] * loc[3]) * pb_h);

        float obj_x1 = bbox_cx - bbox_w * 0.5f;
        float obj_y1 = bbox_cy - bbox_h * 0.5f;
        float obj_x2 = bbox_cx + bbox_w * 0.5f;
        float obj_y2 = bbox_cy + bbox_h * 0.5f;

        // clip
        obj_x1 = std::max(std::min(obj_x1 * image.cols, (float)(image.cols - 1)), 0.f);
        obj_y1 = std::max(std::min(obj_y1 * image.rows, (float)(image.rows - 1)), 0.f);
        obj_x2 = std::max(std::min(obj_x2 * image.cols, (float)(image.cols - 1)), 0.f);
        obj_y2 = std::max(std::min(obj_y2 * image.rows, (float)(image.rows - 1)), 0.f);

        // append object
        Object obj;
        obj.rect = cv::Rect_<float>(obj_x1, obj_y1, obj_x2 - obj_x1 + 1, obj_y2 - obj_y1 + 1);
        obj.label = label;
        obj.prob = score;
        obj.maskdata = std::vector<float>(maskdata, maskdata + mask.w);

        class_candidates[label].push_back(obj);
    }

    objects.clear();
    for (int i = 0; i < (int)class_candidates.size(); i++)
    {
        std::vector<Object>& candidates = class_candidates[i];

        qsort_descent_inplace(candidates);

        std::vector<int> picked;
        nms_sorted_bboxes(candidates, picked, nms_threshold);

        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            objects.push_back(candidates[z]);
        }
    }

    qsort_descent_inplace(objects);

    // keep_top_k
    if (keep_top_k < (int)objects.size())
    {
        objects.resize(keep_top_k);
    }

    // generate mask
    for (int i = 0; i < objects.size(); i++)
    {
        Object& obj = objects[i];

        cv::Mat mask(maskmaps.h, maskmaps.w, CV_32FC1);
        {
            mask = cv::Scalar(0.f);

            for (int p = 0; p < maskmaps.c; p++)
            {
                const float* maskmap = maskmaps.channel(p);
                float coeff = obj.maskdata[p];
                float* mp = (float*)mask.data;

                // mask += m * coeff
                for (int j = 0; j < maskmaps.w * maskmaps.h; j++)
                {
                    mp[j] += maskmap[j] * coeff;
                }
            }
        }

        cv::Mat mask2;
        cv::resize(mask, mask2, cv::Size(img_w, img_h));

        // crop obj box and binarize
        obj.mask = cv::Mat(img_h, img_w, CV_8UC1);
        {
            obj.mask = cv::Scalar(0);

            for (int y = 0; y < img_h; y++)
            {
                if (y < obj.rect.y || y > obj.rect.y + obj.rect.height)
                    continue;

                const float* mp2 = mask2.ptr<const float>(y);
                uchar* bmp = obj.mask.ptr<uchar>(y);

                for (int x = 0; x < img_w; x++)
                {
                    if (x < obj.rect.x || x > obj.rect.x + obj.rect.width)
                        continue;

                    bmp[x] = mp2[x] > 0.5f ? 255 : 0;
                }
            }
        }
    }

    return 0;    
}